

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx *mtctx,buffer_t buffer)

{
  pthread_mutex_t *__mutex;
  uint uVar1;
  uint uVar2;
  int iVar3;
  BYTE *pBVar4;
  range_t range;
  range_t range_00;
  
  if ((mtctx->params).ldmParams.enableLdm != ZSTD_ps_enable) {
    return;
  }
  __mutex = &(mtctx->serial).ldmWindowMutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  do {
    uVar1 = (mtctx->serial).ldmWindow.dictLimit;
    uVar2 = (mtctx->serial).ldmWindow.lowLimit;
    range.size._0_4_ = uVar1 - uVar2;
    range.start = (mtctx->serial).ldmWindow.dictBase + uVar2;
    range.size._4_4_ = 0;
    iVar3 = ZSTDMT_isOverlapped(buffer,range);
    if (iVar3 == 0) {
      pBVar4 = (mtctx->serial).ldmWindow.base + uVar1;
      range_00.size = (long)(mtctx->serial).ldmWindow.nextSrc - (long)pBVar4;
      range_00.start = pBVar4;
      iVar3 = ZSTDMT_isOverlapped(buffer,range_00);
      if (iVar3 == 0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return;
      }
    }
    pthread_cond_wait((pthread_cond_t *)&(mtctx->serial).ldmWindowCond,(pthread_mutex_t *)__mutex);
  } while( true );
}

Assistant:

static void ZSTDMT_waitForLdmComplete(ZSTDMT_CCtx* mtctx, buffer_t buffer)
{
    if (mtctx->params.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_pthread_mutex_t* mutex = &mtctx->serial.ldmWindowMutex;
        DEBUGLOG(5, "ZSTDMT_waitForLdmComplete");
        DEBUGLOG(5, "source  [0x%zx, 0x%zx)",
                    (size_t)buffer.start,
                    (size_t)buffer.start + buffer.capacity);
        ZSTD_PTHREAD_MUTEX_LOCK(mutex);
        while (ZSTDMT_doesOverlapWindow(buffer, mtctx->serial.ldmWindow)) {
            DEBUGLOG(5, "Waiting for LDM to finish...");
            ZSTD_pthread_cond_wait(&mtctx->serial.ldmWindowCond, mutex);
        }
        DEBUGLOG(6, "Done waiting for LDM to finish");
        ZSTD_pthread_mutex_unlock(mutex);
    }
}